

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::api::json::DecodePsbtRequest::ConvertFromStruct
          (DecodePsbtRequest *this,DecodePsbtRequestStruct *data)

{
  string *in_RSI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  std::__cxx11::string::operator=((string *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header,in_RSI);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count,in_RSI + 0x20);
  *(byte *)&in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (byte)in_RSI[0x40] & 1;
  *(byte *)((long)&in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) =
       (byte)in_RSI[0x41] & 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,in_RDI);
  return;
}

Assistant:

void DecodePsbtRequest::ConvertFromStruct(
    const DecodePsbtRequestStruct& data) {
  psbt_ = data.psbt;
  network_ = data.network;
  has_detail_ = data.has_detail;
  has_simple_ = data.has_simple;
  ignore_items = data.ignore_items;
}